

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall spvtools::opt::Loop::SetLatchBlock(Loop *this,BasicBlock *latch)

{
  BasicBlock *this_00;
  bool bVar1;
  Function *pFVar2;
  anon_class_8_1_8991fb9c local_48;
  function<void_(unsigned_int)> local_40;
  BasicBlock *local_20;
  BasicBlock *const_latch;
  BasicBlock *latch_local;
  Loop *this_local;
  
  const_latch = latch;
  latch_local = (BasicBlock *)this;
  pFVar2 = BasicBlock::GetParent(latch);
  this_00 = const_latch;
  if (pFVar2 == (Function *)0x0) {
    __assert_fail("latch->GetParent() && \"The basic block does not belong to a function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x123,"void spvtools::opt::Loop::SetLatchBlock(BasicBlock *)");
  }
  local_20 = const_latch;
  local_48.this = this;
  std::function<void(unsigned_int)>::
  function<spvtools::opt::Loop::SetLatchBlock(spvtools::opt::BasicBlock*)::__0,void>
            ((function<void(unsigned_int)> *)&local_40,&local_48);
  BasicBlock::ForEachSuccessorLabel(this_00,&local_40);
  std::function<void_(unsigned_int)>::~function(&local_40);
  bVar1 = IsInsideLoop(this,const_latch);
  if (!bVar1) {
    __assert_fail("IsInsideLoop(latch) && \"The continue block is not in the loop\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,299,"void spvtools::opt::Loop::SetLatchBlock(BasicBlock *)");
  }
  SetLatchBlockImpl(this,const_latch);
  return;
}

Assistant:

void Loop::SetLatchBlock(BasicBlock* latch) {
#ifndef NDEBUG
  assert(latch->GetParent() && "The basic block does not belong to a function");

  const auto* const_latch = latch;
  const_latch->ForEachSuccessorLabel([this](uint32_t id) {
    assert((!IsInsideLoop(id) || id == GetHeaderBlock()->id()) &&
           "A predecessor of the continue block does not belong to the loop");
  });
#endif  // NDEBUG
  assert(IsInsideLoop(latch) && "The continue block is not in the loop");

  SetLatchBlockImpl(latch);
}